

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler_internal.h
# Opt level: O2

size_t __thiscall
cubeb_resampler_speex_one_way<short>::output
          (cubeb_resampler_speex_one_way<short> *this,short *output_buffer,size_t output_frame_count
          )

{
  uint32_t out_len;
  uint32_t in_len;
  uint local_28;
  uint local_24;
  
  local_24 = (uint)((this->resampling_in_buffer).length_ / (ulong)(this->super_processor).channels);
  local_28 = (uint)output_frame_count;
  speex_resample(this,(this->resampling_in_buffer).data_,&local_24,output_buffer,&local_28);
  auto_array<short>::pop
            (&this->resampling_in_buffer,(short *)0x0,
             (ulong)(this->super_processor).channels * (ulong)local_24);
  return (ulong)local_28;
}

Assistant:

size_t output(T * output_buffer, size_t output_frame_count)
  {
    uint32_t in_len = samples_to_frames(resampling_in_buffer.length());
    uint32_t out_len = output_frame_count;

    speex_resample(resampling_in_buffer.data(), &in_len, output_buffer,
                   &out_len);

    /* This shifts back any unresampled samples to the beginning of the input
       buffer. */
    resampling_in_buffer.pop(nullptr, frames_to_samples(in_len));

    return out_len;
  }